

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receiver_cluster.hpp
# Opt level: O2

void cluster_points_recalculate(int n,int n_cluster,vec3f *positions,int *clusterids)

{
  undefined4 uVar1;
  float fVar2;
  int *piVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  long lVar6;
  uint uVar7;
  int i;
  int iVar8;
  long lVar9;
  ostream *poVar10;
  long lVar11;
  ulong uVar12;
  int *piVar13;
  vec3f *__s;
  vec3f *b;
  int *piVar14;
  int j;
  void *__s_00;
  ulong uVar15;
  int i_2;
  ulong uVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float in_XMM2_Db;
  vec3f vVar20;
  _Vector_base<int,_std::allocator<int>_> _Stack_290;
  undefined1 local_278 [8];
  ofstream fout;
  float local_4c;
  int local_38;
  uint local_34;
  
  _Stack_290._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1555df;
  local_34 = n_cluster;
  std::__cxx11::string::string((string *)local_278,"receiver cluster",(allocator *)&local_38);
  _Stack_290._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1555f2;
  github111116::ConsoleLogger::time(&console,(time_t *)local_278);
  _Stack_290._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1555fe;
  std::__cxx11::string::~string((string *)local_278);
  uVar15 = (ulong)local_34;
  lVar11 = uVar15 * 0xc;
  lVar6 = -(lVar11 + 0xfU & 0xfffffffffffffff0);
  __s = (vec3f *)(local_278 + lVar6);
  if (local_34 != 0) {
    uVar12 = lVar11 - 0xc;
    *(undefined8 *)(local_278 + lVar6 + -8) = 0xc;
    uVar16 = *(ulong *)(local_278 + lVar6 + -8);
    *(undefined8 *)(local_278 + lVar6 + -8) = 0x155643;
    memset(__s,0,(uVar12 - uVar12 % uVar16) + 0xc);
  }
  lVar11 = 0;
  uVar16 = 0;
  if (0 < (int)local_34) {
    uVar16 = (ulong)local_34;
  }
  for (; uVar16 * 0xc - lVar11 != 0; lVar11 = lVar11 + 0xc) {
    *(undefined8 *)(local_278 + lVar6 + -8) = 0x155666;
    iVar8 = rand();
    *(undefined8 *)((long)&__s->x + lVar11) = *(undefined8 *)(positions + iVar8 % n);
    *(data_t *)(&fout + lVar11 + lVar6) = positions[iVar8 % n].z;
  }
  lVar11 = uVar15 * 0x18;
  __s_00 = (void *)((long)__s - (lVar11 + 0xfU & 0xfffffffffffffff0));
  if (local_34 != 0) {
    *(undefined8 *)((long)__s_00 + -8) = 0x18;
    uVar15 = *(ulong *)((long)__s_00 + -8);
    *(undefined8 *)((long)__s_00 + -8) = 0x1556cc;
    memset(__s_00,0,((lVar11 - 0x18U) - (lVar11 - 0x18U) % uVar15) + 0x18);
  }
  for (local_278._0_4_ = 0; (int)local_278._0_4_ < 10; local_278._0_4_ = local_278._0_4_ + 1) {
    *(undefined8 *)((long)__s_00 + -8) = 0x15570b;
    github111116::ConsoleLogger::log<char[27],int>
              (&console,(char (*) [27])"receiver cluster iteration",(int *)local_278);
    for (lVar9 = 0; uVar16 * 0x18 != lVar9; lVar9 = lVar9 + 0x18) {
      if (*(long *)((long)__s_00 + lVar9 + 8) != *(long *)((long)__s_00 + lVar9)) {
        *(long *)((long)__s_00 + lVar9 + 8) = *(long *)((long)__s_00 + lVar9);
      }
    }
    for (local_38 = 0; local_38 < n; local_38 = local_38 + 1) {
      uVar12 = 0;
      local_4c = 1e+18;
      b = __s;
      for (uVar15 = 0; uVar16 != uVar15; uVar15 = uVar15 + 1) {
        lVar9 = (long)local_38;
        *(undefined8 *)((long)__s_00 + -8) = 0x155766;
        vVar20 = operator-(positions + lVar9,b);
        in_XMM2_Db = vVar20.y * vVar20.y;
        if (SQRT(vVar20.z * vVar20.z + vVar20.x * vVar20.x + in_XMM2_Db) < local_4c) {
          lVar9 = (long)local_38;
          *(undefined8 *)((long)__s_00 + -8) = 0x1557a1;
          vVar20 = operator-(positions + lVar9,b);
          in_XMM2_Db = vVar20.y * vVar20.y;
          local_4c = SQRT(vVar20.z * vVar20.z + vVar20.x * vVar20.x + in_XMM2_Db);
          uVar12 = uVar15 & 0xffffffff;
        }
        b = b + 1;
      }
      *(undefined8 *)((long)__s_00 + -8) = 0x1557ea;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)((long)(int)uVar12 * 0x18 + (long)__s_00),
                 &local_38);
    }
    for (uVar15 = 0; uVar15 != uVar16; uVar15 = uVar15 + 1) {
      piVar3 = *(int **)((long)__s_00 + uVar15 * 0x18 + 8);
      fVar17 = 0.0;
      piVar13 = *(int **)((long)__s_00 + uVar15 * 0x18);
      auVar19 = ZEXT816(0);
      fVar2 = in_XMM2_Db;
      for (piVar14 = piVar13; piVar14 != piVar3; piVar14 = piVar14 + 1) {
        uVar1 = positions[*piVar14].x;
        fVar2 = positions[*piVar14].y;
        auVar18._0_4_ = auVar19._0_4_ + (float)uVar1;
        auVar18._4_4_ = auVar19._4_4_ + fVar2;
        auVar18._8_4_ = auVar19._8_4_ + 0.0;
        auVar18._12_4_ = auVar19._12_4_ + 0.0;
        fVar17 = fVar17 + positions[*piVar14].z;
        auVar19 = auVar18;
      }
      in_XMM2_Db = (float)(ulong)((long)piVar3 - (long)piVar13 >> 2);
      auVar5._4_4_ = in_XMM2_Db;
      auVar5._0_4_ = in_XMM2_Db;
      auVar5._8_4_ = fVar2;
      auVar5._12_4_ = fVar2;
      auVar19 = divps(auVar19,auVar5);
      __s[uVar15].x = (data_t)(int)auVar19._0_8_;
      __s[uVar15].y = (data_t)(int)((ulong)auVar19._0_8_ >> 0x20);
      *(float *)(&fout + uVar15 * 0xc + lVar6) = fVar17 / in_XMM2_Db;
    }
  }
  for (uVar15 = 0; uVar15 != uVar16; uVar15 = uVar15 + 1) {
    piVar3 = *(int **)((long)__s_00 + uVar15 * 0x18 + 8);
    for (piVar13 = *(int **)((long)__s_00 + uVar15 * 0x18); piVar13 != piVar3; piVar13 = piVar13 + 1
        ) {
      clusterids[*piVar13] = (int)uVar15;
    }
  }
  *(undefined8 *)((long)__s_00 + -8) = 0x1558cc;
  std::__cxx11::string::string((string *)local_278,"receiver cluster",(allocator *)&local_38);
  *(undefined8 *)((long)__s_00 + -8) = 0x1558df;
  github111116::ConsoleLogger::timeEnd(&console,(string *)local_278);
  *(undefined8 *)((long)__s_00 + -8) = 0x1558eb;
  std::__cxx11::string::~string((string *)local_278);
  *(undefined8 *)((long)__s_00 + -8) = 0x1558fe;
  github111116::ConsoleLogger::log<char[27]>(&console,(char (*) [27])"cluster caching to disk...");
  *(undefined8 *)((long)__s_00 + -8) = 0x10;
  uVar4 = *(undefined8 *)((long)__s_00 + -8);
  *(undefined8 *)((long)__s_00 + -8) = 0x155914;
  std::ofstream::ofstream(local_278,"cluster.cache",(_Ios_Openmode)uVar4);
  *(undefined8 *)((long)__s_00 + -8) = 0x155924;
  poVar10 = (ostream *)std::ostream::operator<<(local_278,n);
  *(undefined8 *)((long)__s_00 + -8) = 0x155933;
  std::operator<<(poVar10,"\n");
  uVar7 = local_34;
  *(undefined8 *)((long)__s_00 + -8) = 0x155942;
  poVar10 = (ostream *)std::ostream::operator<<(local_278,uVar7);
  *(undefined8 *)((long)__s_00 + -8) = 0x155951;
  std::operator<<(poVar10,"\n");
  uVar16 = 0;
  uVar15 = (ulong)(uint)n;
  if (n < 1) {
    uVar15 = uVar16;
  }
  for (; uVar15 * 0xc - uVar16 != 0; uVar16 = uVar16 + 0xc) {
    fVar2 = *(float *)((long)&positions->x + uVar16);
    *(undefined8 *)((long)__s_00 + -8) = 0x155986;
    poVar10 = (ostream *)std::ostream::operator<<(local_278,fVar2);
    *(undefined8 *)((long)__s_00 + -8) = 0x155991;
    poVar10 = std::operator<<(poVar10," ");
    fVar2 = *(float *)((long)&positions->y + uVar16);
    *(undefined8 *)((long)__s_00 + -8) = 0x1559a0;
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,fVar2);
    *(undefined8 *)((long)__s_00 + -8) = 0x1559ab;
    poVar10 = std::operator<<(poVar10," ");
    fVar2 = *(float *)((long)&positions->z + uVar16);
    *(undefined8 *)((long)__s_00 + -8) = 0x1559ba;
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,fVar2);
    *(undefined8 *)((long)__s_00 + -8) = 0x1559c9;
    std::operator<<(poVar10,"\n");
  }
  for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
    iVar8 = clusterids[uVar16];
    *(undefined8 *)((long)__s_00 + -8) = 0x1559fa;
    poVar10 = (ostream *)std::ostream::operator<<(local_278,iVar8);
    *(undefined8 *)((long)__s_00 + -8) = 0x155a05;
    std::operator<<(poVar10,"\n");
  }
  *(undefined8 *)((long)__s_00 + -8) = 0x155a16;
  std::ofstream::~ofstream(local_278);
  if (local_34 != 0) {
    do {
      *(undefined8 *)((long)__s_00 + -8) = 0x155a2d;
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)((long)__s_00 + lVar11 + -0x18));
      lVar11 = lVar11 + -0x18;
    } while (lVar11 != 0);
  }
  return;
}

Assistant:

void cluster_points_recalculate(int n, int n_cluster, const vec3f* positions, int* clusterids)
{
	console.time("receiver cluster");
	// random initialize clusters
	vec3f center[n_cluster];
	for (int i=0; i<n_cluster; ++i)
		center[i] = positions[rand()%n]; // a few may coincide, doesn't matter

	std::vector<int> assigned[n_cluster];
	for (int k=0; k<10; ++k) {
		console.log("receiver cluster iteration",k);
		for (int i=0; i<n_cluster; ++i)
			assigned[i].clear();
		// assign points to nearest cluster
		for (int i=0; i<n; ++i) {
			float bestnorm = 1e18;
			int best = 0;
			for (int j=0; j<n_cluster; ++j)
				if (bestnorm > norm(positions[i] - center[j])) {
					bestnorm = norm(positions[i] - center[j]);
					best = j;
				}
			assigned[best].push_back(i);
		}
		// move cluster center to average of points
		for (int i=0; i<n_cluster; ++i) {
			vec3f sum = 0;
			for (int x: assigned[i])
				sum += positions[x];
			center[i] = sum / assigned[i].size();
		}
	}
	for (int i=0; i<n_cluster; ++i)
		for (int x: assigned[i])
			clusterids[x] = i;
	console.timeEnd("receiver cluster");
	console.log("cluster caching to disk...");
	std::ofstream fout(cluster_file);
	fout << n << "\n";
	fout << n_cluster << "\n";
	for (int i=0; i<n; ++i)
		fout << positions[i].x << " " << positions[i].y << " " << positions[i].z << "\n";
	for (int i=0; i<n; ++i)
		fout << clusterids[i] << "\n";
}